

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O0

void __thiscall AddTestCase::AddTestCase(AddTestCase *this,char *name,TestFunc *func)

{
  TestSet *value;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *key;
  HashTable<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)(),_axl::sl::HashDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>,_axl::sl::EqDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&,_void_(*)()>
  *in_stack_ffffffffffffffa8;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffffb0;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_38;
  
  value = getTestCaseSet();
  key = &local_38;
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
            (in_stack_ffffffffffffffb0,(C *)in_stack_ffffffffffffffa8);
  axl::sl::
  HashTable<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)(),_axl::sl::HashDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>,_axl::sl::EqDuckType<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&>,_const_axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>_&,_void_(*)()>
  ::add(in_stack_ffffffffffffffa8,key,(TestFunc *)value);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x10bf0e);
  return;
}

Assistant:

AddTestCase(
		const char* name,
		TestFunc* func
	) {
		getTestCaseSet()->add(name, func);
	}